

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdgesOptimized
          (S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  CellQueue *this_00;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> _Var1;
  char cVar2;
  const_reference pQVar3;
  S2CellId SVar4;
  S2CellId SVar5;
  QueueEntry entry;
  S2CellId id;
  QueueEntry local_1e8;
  double local_1c8;
  S1ChordAngle local_1c0;
  InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
  local_1b8;
  
  InitQueue(this);
  if (1 < (this->queue_).c.allocator_and_tag_.tag_.size_) {
    this_00 = &this->queue_;
    do {
      pQVar3 = absl::
               InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
               ::front(&this_00->c);
      local_1e8.distance.super_S1ChordAngle.length2_ =
           (S1ChordAngle)(pQVar3->distance).super_S1ChordAngle.length2_;
      local_1e8.id.id_ = (pQVar3->id).id_;
      local_1e8.index_cell = pQVar3->index_cell;
      std::
      priority_queue<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_absl::InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
      ::pop(this_00);
      local_1c8 = (this->distance_limit_).super_S1ChordAngle.length2_;
      local_1c0 = local_1e8.distance.super_S1ChordAngle.length2_;
      if ((double)local_1e8.distance.super_S1ChordAngle.length2_ < local_1c8) {
        if (local_1e8.index_cell == (S2ShapeIndexCell *)0x0) {
          local_1b8.allocator_and_tag_.tag_.size_ = (Tag)(Tag)local_1e8.id.id_;
          SVar4 = S2CellId::child((S2CellId *)&local_1b8,1);
          _Var1._M_head_impl =
               (this->iter_).iter_._M_t.
               super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x30))
                    (_Var1._M_head_impl,SVar4.id_ - (~SVar4.id_ & SVar4.id_ - 1));
          SVar4.id_ = (((this->iter_).iter_._M_t.
                        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->
                      id_).id_;
          if (SVar4.id_ != 0xffffffffffffffff) {
            SVar5 = S2CellId::child((S2CellId *)&local_1b8,1);
            if (SVar4.id_ <= (SVar5.id_ - 1 | SVar5.id_)) {
              SVar4 = S2CellId::child((S2CellId *)&local_1b8,1);
              ProcessOrEnqueue(this,SVar4);
            }
          }
          cVar2 = (**(code **)((long)((this->iter_).iter_._M_t.
                                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                                     _M_head_impl)->_vptr_IteratorBase + 0x28))();
          if ((cVar2 != '\0') &&
             ((long)local_1b8.allocator_and_tag_.tag_.size_ -
              (~(ulong)local_1b8.allocator_and_tag_.tag_.size_ &
              (long)local_1b8.allocator_and_tag_.tag_.size_ - 1U) <=
              (((this->iter_).iter_._M_t.
                super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->id_).id_)
             ) {
            SVar4 = S2CellId::child((S2CellId *)&local_1b8,0);
            ProcessOrEnqueue(this,SVar4);
          }
          SVar4 = S2CellId::child((S2CellId *)&local_1b8,3);
          _Var1._M_head_impl =
               (this->iter_).iter_._M_t.
               super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
               .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl;
          (**(code **)((long)(_Var1._M_head_impl)->_vptr_IteratorBase + 0x30))
                    (_Var1._M_head_impl,SVar4.id_ - (~SVar4.id_ & SVar4.id_ - 1));
          SVar4.id_ = (((this->iter_).iter_._M_t.
                        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)->
                      id_).id_;
          if ((SVar4.id_ != 0xffffffffffffffff) &&
             (SVar4.id_ <=
              ((long)local_1b8.allocator_and_tag_.tag_.size_ - 1U |
              (ulong)local_1b8.allocator_and_tag_.tag_.size_))) {
            SVar4 = S2CellId::child((S2CellId *)&local_1b8,3);
            ProcessOrEnqueue(this,SVar4);
          }
          cVar2 = (**(code **)((long)((this->iter_).iter_._M_t.
                                      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                                     _M_head_impl)->_vptr_IteratorBase + 0x28))();
          if (cVar2 != '\0') {
            SVar4.id_ = (((this->iter_).iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)
                        ->id_).id_;
            SVar5 = S2CellId::child((S2CellId *)&local_1b8,2);
            if (SVar5.id_ - (~SVar5.id_ & SVar5.id_ - 1) <= SVar4.id_) {
              SVar4 = S2CellId::child((S2CellId *)&local_1b8,2);
              ProcessOrEnqueue(this,SVar4);
            }
          }
        }
        else {
          ProcessEdges(this,&local_1e8);
        }
      }
      else {
        local_1b8.allocator_and_tag_.tag_.size_ = (Tag)0;
        absl::
        InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
        ::operator=(&this_00->c,&local_1b8);
        absl::
        InlinedVector<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::QueueEntry>_>
        ::clear(&local_1b8);
      }
    } while ((local_1c0.length2_ < local_1c8) && (1 < (this_00->c).allocator_and_tag_.tag_.size_));
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesOptimized() {
  InitQueue();
  // Repeatedly find the closest S2Cell to "target" and either split it into
  // its four children or process all of its edges.
  while (!queue_.empty()) {
    // We need to copy the top entry before removing it, and we need to
    // remove it before adding any new entries to the queue.
    QueueEntry entry = queue_.top();
    queue_.pop();
    // Work around weird parse error in gcc 4.9 by using a local variable for
    // entry.distance.
    Distance distance = entry.distance;
    if (!(distance < distance_limit_)) {
      queue_ = CellQueue();  // Clear any remaining entries.
      break;
    }
    // If this is already known to be an index cell, just process it.
    if (entry.index_cell != nullptr) {
      ProcessEdges(entry);
      continue;
    }
    // Otherwise split the cell into its four children.  Before adding a
    // child back to the queue, we first check whether it is empty.  We do
    // this in two seek operations rather than four by seeking to the key
    // between children 0 and 1 and to the key between children 2 and 3.
    S2CellId id = entry.id;
    iter_.Seek(id.child(1).range_min());
    if (!iter_.done() && iter_.id() <= id.child(1).range_max()) {
      ProcessOrEnqueue(id.child(1));
    }
    if (iter_.Prev() && iter_.id() >= id.range_min()) {
      ProcessOrEnqueue(id.child(0));
    }
    iter_.Seek(id.child(3).range_min());
    if (!iter_.done() && iter_.id() <= id.range_max()) {
      ProcessOrEnqueue(id.child(3));
    }
    if (iter_.Prev() && iter_.id() >= id.child(2).range_min()) {
      ProcessOrEnqueue(id.child(2));
    }
  }
}